

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-hand.cpp
# Opt level: O0

FreeTiles * __thiscall
mahjong::PlayerHand::makeFreeTiles(FreeTiles *__return_storage_ptr__,PlayerHand *this)

{
  bool bVar1;
  allocator<mahjong::Tile> local_29;
  _Rb_tree_const_iterator<mahjong::Tile> local_28;
  _Rb_tree_const_iterator<mahjong::Tile> local_20;
  PlayerHand *local_18;
  PlayerHand *this_local;
  
  local_18 = this;
  this_local = (PlayerHand *)__return_storage_ptr__;
  bVar1 = std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::empty(&this->melds);
  if (bVar1) {
    local_20._M_node =
         (_Base_ptr)
         std::multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>::
         begin(&this->tiles);
    local_28._M_node =
         (_Base_ptr)
         std::multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>::end
                   (&this->tiles);
    std::allocator<mahjong::Tile>::allocator(&local_29);
    std::vector<mahjong::Tile,std::allocator<mahjong::Tile>>::
    vector<std::_Rb_tree_const_iterator<mahjong::Tile>,void>
              ((vector<mahjong::Tile,std::allocator<mahjong::Tile>> *)__return_storage_ptr__,
               local_20,local_28,&local_29);
    std::allocator<mahjong::Tile>::~allocator(&local_29);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PlayerHand::FreeTiles PlayerHand::makeFreeTiles() const
{
	if (melds.empty())
	{
		return FreeTiles(tiles.begin(), tiles.end());
	}

	return {};
}